

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_CCtx_params params_00;
  uint uVar1;
  size_t code;
  undefined8 in_RSI;
  U64 in_RDI;
  long in_R9;
  ZSTD_CCtx *unaff_retaddr;
  ZSTD_CCtx_params in_stack_00000010;
  size_t dictID;
  size_t errcod;
  undefined1 in_stack_00000164 [100];
  size_t dictSize_00;
  void *dict_00;
  ZSTD_CCtx_params *params_01;
  ZSTD_matchState_t *ms;
  ZSTD_compressedBlockState_t *bs;
  ZSTD_dictTableLoadMethod_e dtlm_00;
  void *workspace;
  ZSTD_CDict *in_stack_fffffffffffffff8;
  
  if ((in_R9 == 0) || (*(long *)(in_R9 + 0x10) == 0)) {
    workspace = in_stack_00000010.ldmParams._4_8_;
    dtlm_00 = in_stack_00000010.overlapSizeLog;
    dictSize_00 = in_stack_00000010.cParams._4_8_;
    dict_00 = in_stack_00000010.cParams._12_8_;
    params_01 = in_stack_00000010.cParams._20_8_;
    ms = in_stack_00000010.fParams._0_8_;
    bs = in_stack_00000010._40_8_;
    params_00.cParams._4_8_ = pledgedSrcSize;
    params_00._0_8_ = params.customMem.opaque;
    params_00.cParams.searchLog = zbuff;
    params_00._20_100_ = in_stack_00000164;
    code = ZSTD_resetCCtx_internal
                     ((ZSTD_CCtx *)params._88_8_,params_00,params.ldmParams._12_8_,
                      params.ldmParams.bucketSizeLog,params.ldmParams.hashLog);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      code = ZSTD_compress_insertDictionary
                       (bs,ms,params_01,dict_00,dictSize_00,
                        (ZSTD_dictContentType_e)((ulong)*(undefined8 *)(in_RDI + 0x310) >> 0x20),
                        dtlm_00,workspace);
      uVar1 = ZSTD_isError(0x28a0fc);
      if (uVar1 == 0) {
        *(int *)(in_RDI + 0x100) = (int)code;
        code = 0;
      }
    }
  }
  else {
    code = ZSTD_resetCCtx_usingCDict
                     (unaff_retaddr,in_stack_fffffffffffffff8,in_stack_00000010,in_RDI,
                      (ZSTD_buffered_policy_e)((ulong)in_RSI >> 0x20));
  }
  return code;
}

Assistant:

size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                             ZSTD_dictContentType_e dictContentType,
                             ZSTD_dictTableLoadMethod_e dtlm,
                             const ZSTD_CDict* cdict,
                             ZSTD_CCtx_params params, U64 pledgedSrcSize,
                             ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params.cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (cdict && cdict->dictContentSize>0) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    CHECK_F( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     ZSTDcrp_continue, zbuff) );
    {
        size_t const dictID = ZSTD_compress_insertDictionary(
                cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                &params, dict, dictSize, dictContentType, dtlm, cctx->entropyWorkspace);
        if (ZSTD_isError(dictID)) return dictID;
        assert(dictID <= (size_t)(U32)-1);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}